

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::StdGrammarStackElement::SetErrorData
          (StdGrammarStackElement *this,TokenType *t,
          TokenStream<SGParser::Generator::StdGrammarToken> *stream)

{
  String *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 local_78 [2];
  TokenType tok;
  
  local_78[0] = 1;
  tok._0_8_ = &tok.Str._M_string_length;
  tok.Str._M_dataplus._M_p = (pointer)0x0;
  tok.Str._M_string_length._0_1_ = 0;
  tok.Str.field_2._8_8_ = 0;
  tok.Line = 0;
  (*stream->_vptr_TokenStream[2])(stream,local_78);
  if ((this->field_1).pData == (void *)0x0) {
    this_00 = (String *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)&tok);
    (this->field_1).pString = this_00;
    this->Type = 0x20000000;
    this->Line = tok.Str.field_2._8_8_;
    this->Offset = tok.Line;
    if (this->MaxErrorStrLength < this_00->_M_string_length) {
      std::__cxx11::string::substr((ulong)&tok.Offset,(ulong)this_00);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &tok.Offset,"...");
      std::__cxx11::string::operator=((string *)(this->field_1).pString,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&tok.Offset);
    }
    std::__cxx11::string::~string((string *)&tok);
    return;
  }
  __assert_fail("pData == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                ,0x1f5,
                "void SGParser::Generator::StdGrammarStackElement::SetErrorData(TokenType &, TokenStream<TokenType> &)"
               );
}

Assistant:

void SetErrorData([[maybe_unused]] TokenType& t, TokenStream<TokenType>& stream) {
        TokenType tok;
        stream.GetNextToken(tok);
        // Get Error token String
        SG_ASSERT(pData == nullptr);
        pString = new String{tok.Str};
        Type    = DataString;
        Line    = tok.Line;
        Offset  = tok.Offset;

        // Shorten the error to MaxErrorStrLength characters and add three dots
        if (pString->size() > MaxErrorStrLength)
            *pString = pString->substr(0u, MaxErrorStrLength) + "...";
    }